

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O1

stbi_uc * tga_load(stbi *s,int *x,int *y,int *comp,int req_comp)

{
  stbi_uc sVar1;
  byte bVar2;
  undefined1 uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  stbi_uc *psVar9;
  undefined7 uVar10;
  uint uVar11;
  ulong uVar12;
  long __off;
  ulong uVar13;
  undefined4 in_register_00000084;
  int *piVar14;
  uint uVar15;
  uint uVar16;
  ulong __n;
  int *piVar17;
  ulong uVar18;
  bool bVar19;
  uchar raw_data [4];
  undefined1 local_c4 [4];
  uint *local_c0;
  ulong local_b8;
  ulong local_b0;
  int local_a4;
  undefined8 local_a0;
  int *local_98;
  int local_8c;
  ulong local_88;
  int local_7c;
  ulong local_78;
  ulong local_70;
  int *local_68;
  stbi_uc *local_60;
  ulong local_58;
  int local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  ulong local_40;
  ulong local_38;
  
  local_78 = CONCAT44(in_register_00000084,req_comp);
  local_c0 = (uint *)comp;
  local_98 = x;
  local_68 = y;
  iVar4 = get8(s);
  local_b8 = CONCAT44(local_b8._4_4_,iVar4);
  local_8c = get8(s);
  uVar5 = get8(s);
  iVar4 = get8(s);
  local_a0 = CONCAT44(local_a0._4_4_,iVar4);
  iVar4 = get8(s);
  local_70 = CONCAT44(local_70._4_4_,iVar4);
  iVar4 = get8(s);
  local_58 = CONCAT44(local_58._4_4_,iVar4);
  local_a4 = get8(s);
  iVar4 = get8(s);
  local_b0 = CONCAT44(extraout_var,iVar4);
  get8(s);
  get8(s);
  get8(s);
  get8(s);
  iVar4 = get8(s);
  iVar6 = get8(s);
  iVar4 = iVar6 * 0x100 + iVar4;
  uVar7 = get8(s);
  iVar6 = get8(s);
  iVar8 = get8(s);
  local_88 = CONCAT44(extraout_var_00,iVar8);
  local_48 = get8(s);
  uVar15 = (uVar5 & 0xff) - 8;
  if ((uVar5 & 0xf8) == 0) {
    uVar15 = uVar5 & 0xff;
  }
  piVar17 = (int *)0x0;
  if (0 < iVar4) {
    local_40 = (ulong)(uint)(iVar6 * 0x100);
    local_50 = iVar6 * 0x100 + uVar7;
    if ((0 < local_50) && (0xfffffffc < uVar15 - 4)) {
      if ((byte)((char)local_88 << 5 | (byte)((char)local_88 - 8U) >> 3) < 4) {
        uVar16 = (uint)local_b8 & 0xff;
        local_a4 = local_a4 << 8;
        uVar15 = (uint)local_b0 & 0xff;
        local_4c = (uint)local_88 & 0xff;
        if ((char)local_8c != '\0') {
          local_4c = uVar15;
        }
        local_88 = (ulong)local_4c;
        *local_98 = iVar4;
        *local_68 = local_50;
        iVar6 = (int)local_78;
        local_4c = local_4c >> 3;
        local_78 = local_78 & 0xffffffff;
        if (iVar6 - 5U < 0xfffffffc) {
          local_78 = (ulong)local_4c;
        }
        *local_c0 = local_4c;
        uVar11 = local_50 * iVar4;
        local_7c = iVar4;
        local_44 = uVar5;
        local_38 = (ulong)uVar7;
        psVar9 = (stbi_uc *)malloc((ulong)((int)local_78 * uVar11));
        if ((FILE *)s->img_file == (FILE *)0x0) {
          s->img_buffer = s->img_buffer + uVar16;
        }
        else {
          fseek((FILE *)s->img_file,(ulong)uVar16,1);
        }
        uVar18 = local_88;
        local_a4 = local_a4 + (int)local_58;
        local_98 = (int *)psVar9;
        if ((char)local_8c == '\0') {
          local_60 = (stbi_uc *)0x0;
        }
        else {
          __off = (long)((int)local_70 * 0x100 + (int)local_a0);
          if ((FILE *)s->img_file == (FILE *)0x0) {
            s->img_buffer = s->img_buffer + __off;
          }
          else {
            fseek((FILE *)s->img_file,__off,1);
          }
          iVar6 = uVar15 * local_a4;
          iVar4 = iVar6 + 7;
          if (-1 < iVar6) {
            iVar4 = iVar6;
          }
          local_60 = (stbi_uc *)malloc((long)(iVar4 >> 3));
          getn(s,local_60,iVar4 >> 3);
        }
        if (0 < (int)uVar11) {
          iVar4 = (int)uVar18;
          local_68 = (int *)CONCAT44(local_68._4_4_,iVar4 << 0x1d | iVar4 - 8U >> 3);
          __n = (ulong)((iVar4 - 1U >> 3) + 1);
          local_58 = (ulong)uVar11;
          uVar13 = (ulong)((int)local_78 - 1);
          uVar12 = 0;
          bVar2 = 0;
          uVar15 = 0;
          iVar4 = 0;
          local_a0 = 0;
          local_b8 = 0;
          local_c0 = (uint *)0x0;
          local_b0 = 0;
          local_70 = uVar13;
          do {
            if ((local_44 & 0xf8) == 0) {
LAB_0015890a:
              bVar19 = false;
            }
            else {
              if (iVar4 == 0) {
                uVar15 = get8(s);
                iVar4 = (uVar15 & 0x7f) + 1;
                uVar15 = uVar15 >> 7 & 1;
                uVar13 = local_70;
                goto LAB_0015890a;
              }
              bVar19 = (bool)(bVar2 & uVar15 != 0);
              uVar15 = (uint)(uVar15 != 0);
            }
            if (bVar19) goto switchD_00158994_default;
            if ((char)local_8c == '\0') {
              if ((int)uVar18 != 0) {
                uVar18 = 0;
                do {
                  iVar6 = get8(s);
                  local_c4[uVar18] = (char)iVar6;
                  uVar18 = uVar18 + 1;
                } while (__n != uVar18);
              }
            }
            else {
              uVar5 = get8(s);
              if ((int)uVar18 != 0) {
                uVar5 = uVar5 & 0xff;
                if (local_a4 <= (int)uVar5) {
                  uVar5 = 0;
                }
                memcpy(local_c4,local_60 + uVar5 * local_4c,__n);
              }
            }
            uVar10 = (undefined7)
                     ((ulong)((long)&switchD_00158994::switchdataD_00188b04 +
                             (long)(int)(&switchD_00158994::switchdataD_00188b04)
                                        [(ulong)local_68 & 0xffffffff]) >> 8);
            uVar13 = local_70;
            uVar18 = local_88;
            switch((ulong)local_68 & 0xffffffff) {
            case 0:
              local_a0 = CONCAT71(uVar10,0xff);
              break;
            case 1:
              local_a0 = CONCAT71(0x188b,local_c4[1]);
              break;
            case 2:
              uVar3 = 0xff;
              goto LAB_001589e1;
            case 3:
              uVar3 = local_c4[3];
LAB_001589e1:
              local_b0 = CONCAT71(uVar10,local_c4[2]);
              local_b8 = CONCAT71(uVar10,local_c4[0]);
              local_c0 = (uint *)CONCAT71(uVar10,local_c4[1]);
              local_a0 = CONCAT71(uVar10,uVar3);
            default:
              goto switchD_00158994_default;
            }
            local_b8 = CONCAT71(uVar10,local_c4[0]);
            local_c0 = (uint *)(local_b8 & 0xffffffff);
            local_b0 = local_b8;
switchD_00158994_default:
            if ((uint)uVar13 < 4) {
              psVar9 = (stbi_uc *)
                       (*(code *)(&DAT_00188b14 + *(int *)(&DAT_00188b14 + uVar13 * 4)))();
              return psVar9;
            }
            iVar4 = iVar4 + -1;
            uVar12 = uVar12 + 1;
            bVar2 = 1;
          } while (uVar12 != local_58);
        }
        piVar17 = local_98;
        if (0 < local_50 && (local_48 & 0x20) == 0) {
          iVar6 = (int)local_78 * local_7c;
          uVar5 = ((int)local_38 + (int)local_40) - 1;
          iVar4 = iVar6 * uVar5;
          uVar7 = 0;
          uVar15 = 0;
          do {
            if (0 < iVar6) {
              piVar14 = local_98;
              iVar8 = iVar6 + 1;
              do {
                sVar1 = *(stbi_uc *)((long)piVar14 + (ulong)uVar7);
                *(stbi_uc *)((long)piVar14 + (ulong)uVar7) =
                     *(stbi_uc *)((long)piVar14 + (long)iVar4);
                *(stbi_uc *)((long)piVar14 + (long)iVar4) = sVar1;
                piVar14 = (int *)((long)piVar14 + 1);
                iVar8 = iVar8 + -1;
              } while (1 < iVar8);
            }
            iVar4 = iVar4 - iVar6;
            uVar7 = uVar7 + iVar6;
            bVar19 = uVar15 != uVar5 >> 1;
            uVar15 = uVar15 + 1;
          } while (bVar19);
        }
        if (local_60 != (stbi_uc *)0x0) {
          free(local_60);
        }
      }
      else {
        piVar17 = (int *)0x0;
      }
    }
  }
  return (stbi_uc *)piVar17;
}

Assistant:

static stbi_uc *tga_load(stbi *s, int *x, int *y, int *comp, int req_comp)
{
	//	read in the TGA header stuff
	int tga_offset = get8u(s);
	int tga_indexed = get8u(s);
	int tga_image_type = get8u(s);
	int tga_is_RLE = 0;
	int tga_palette_start = get16le(s);
	int tga_palette_len = get16le(s);
	int tga_palette_bits = get8u(s);
	int tga_x_origin = get16le(s);
	int tga_y_origin = get16le(s);
	int tga_width = get16le(s);
	int tga_height = get16le(s);
	int tga_bits_per_pixel = get8u(s);
	int tga_inverted = get8u(s);
	//	image data
	unsigned char *tga_data;
	unsigned char *tga_palette = NULL;
	int i, j;
	unsigned char raw_data[4];
	unsigned char trans_data[] = { 0,0,0,0 };
	int RLE_count = 0;
	int RLE_repeating = 0;
	int read_next_pixel = 1;
	//	do a tiny bit of precessing
	if( tga_image_type >= 8 )
	{
		tga_image_type -= 8;
		tga_is_RLE = 1;
	}
	/* int tga_alpha_bits = tga_inverted & 15; */
	tga_inverted = 1 - ((tga_inverted >> 5) & 1);

	//	error check
	if( //(tga_indexed) ||
		(tga_width < 1) || (tga_height < 1) ||
		(tga_image_type < 1) || (tga_image_type > 3) ||
		((tga_bits_per_pixel != 8) && (tga_bits_per_pixel != 16) &&
		(tga_bits_per_pixel != 24) && (tga_bits_per_pixel != 32))
		)
	{
		return NULL;
	}

	//	If I'm paletted, then I'll use the number of bits from the palette
	if( tga_indexed )
	{
		tga_bits_per_pixel = tga_palette_bits;
	}

	//	tga info
	*x = tga_width;
	*y = tga_height;
	if( (req_comp < 1) || (req_comp > 4) )
	{
		//	just use whatever the file was
		req_comp = tga_bits_per_pixel / 8;
		*comp = req_comp;
	} else
	{
		//	force a new number of components
		*comp = tga_bits_per_pixel/8;
	}
	tga_data = (unsigned char*)malloc( tga_width * tga_height * req_comp );

	//	skip to the data's starting position (offset usually = 0)
	skip(s, tga_offset );
	//	do I need to load a palette?
	if( tga_indexed )
	{
		//	any data to skip? (offset usually = 0)
		skip(s, tga_palette_start );
		//	load the palette
		tga_palette = (unsigned char*)malloc( tga_palette_len * tga_palette_bits / 8 );
		getn(s, tga_palette, tga_palette_len * tga_palette_bits / 8 );
	}
	//	load the data
	for( i = 0; i < tga_width * tga_height; ++i )
	{
		//	if I'm in RLE mode, do I need to get a RLE chunk?
		if( tga_is_RLE )
		{
			if( RLE_count == 0 )
			{
				//	yep, get the next byte as a RLE command
				int RLE_cmd = get8u(s);
				RLE_count = 1 + (RLE_cmd & 127);
				RLE_repeating = RLE_cmd >> 7;
				read_next_pixel = 1;
			} else if( !RLE_repeating )
			{
				read_next_pixel = 1;
			}
		} else
		{
			read_next_pixel = 1;
		}
		//	OK, if I need to read a pixel, do it now
		if( read_next_pixel )
		{
			//	load however much data we did have
			if( tga_indexed )
			{
				//	read in 1 byte, then perform the lookup
				int pal_idx = get8u(s);
				if( pal_idx >= tga_palette_len )
				{
					//	invalid index
					pal_idx = 0;
				}
				pal_idx *= tga_bits_per_pixel / 8;
				for( j = 0; j*8 < tga_bits_per_pixel; ++j )
				{
					raw_data[j] = tga_palette[pal_idx+j];
				}
			} else
			{
				//	read in the data raw
				for( j = 0; j*8 < tga_bits_per_pixel; ++j )
				{
					raw_data[j] = get8u(s);
				}
			}
			//	convert raw to the intermediate format
			switch( tga_bits_per_pixel )
			{
			case 8:
				//	Luminous => RGBA
				trans_data[0] = raw_data[0];
				trans_data[1] = raw_data[0];
				trans_data[2] = raw_data[0];
				trans_data[3] = 255;
				break;
			case 16:
				//	Luminous,Alpha => RGBA
				trans_data[0] = raw_data[0];
				trans_data[1] = raw_data[0];
				trans_data[2] = raw_data[0];
				trans_data[3] = raw_data[1];
				break;
			case 24:
				//	BGR => RGBA
				trans_data[0] = raw_data[2];
				trans_data[1] = raw_data[1];
				trans_data[2] = raw_data[0];
				trans_data[3] = 255;
				break;
			case 32:
				//	BGRA => RGBA
				trans_data[0] = raw_data[2];
				trans_data[1] = raw_data[1];
				trans_data[2] = raw_data[0];
				trans_data[3] = raw_data[3];
				break;
			}
			//	clear the reading flag for the next pixel
			read_next_pixel = 0;
		} // end of reading a pixel
		//	convert to final format
		switch( req_comp )
		{
		case 1:
			//	RGBA => Luminance
			tga_data[i*req_comp+0] = compute_y(trans_data[0],trans_data[1],trans_data[2]);
			break;
		case 2:
			//	RGBA => Luminance,Alpha
			tga_data[i*req_comp+0] = compute_y(trans_data[0],trans_data[1],trans_data[2]);
			tga_data[i*req_comp+1] = trans_data[3];
			break;
		case 3:
			//	RGBA => RGB
			tga_data[i*req_comp+0] = trans_data[0];
			tga_data[i*req_comp+1] = trans_data[1];
			tga_data[i*req_comp+2] = trans_data[2];
			break;
		case 4:
			//	RGBA => RGBA
			tga_data[i*req_comp+0] = trans_data[0];
			tga_data[i*req_comp+1] = trans_data[1];
			tga_data[i*req_comp+2] = trans_data[2];
			tga_data[i*req_comp+3] = trans_data[3];
			break;
		}
		//	in case we're in RLE mode, keep counting down
		--RLE_count;
	}
	//	do I need to invert the image?
	if( tga_inverted )
	{
		for( j = 0; j*2 < tga_height; ++j )
		{
			int index1 = j * tga_width * req_comp;
			int index2 = (tga_height - 1 - j) * tga_width * req_comp;
			for( i = tga_width * req_comp; i > 0; --i )
			{
				unsigned char temp = tga_data[index1];
				tga_data[index1] = tga_data[index2];
				tga_data[index2] = temp;
				++index1;
				++index2;
			}
		}
	}
	//	clear my palette, if I had one
	if( tga_palette != NULL )
	{
		free( tga_palette );
	}
	//	the things I do to get rid of an error message, and yet keep
	//	Microsoft's C compilers happy... [8^(
	tga_palette_start = tga_palette_len = tga_palette_bits =
			tga_x_origin = tga_y_origin = 0;
	//	OK, done
	return tga_data;
}